

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgecko.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ostream *this;
  long in_RSI;
  int in_EDI;
  string *this_00;
  string error_2;
  uint size;
  string error_1;
  uint dims;
  string error;
  uint maxsize;
  uint maxdims;
  uint failures;
  uint tests;
  size_t in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  undefined8 in_stack_fffffffffffffd68;
  allocator *paVar3;
  int columns;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  allocator *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  allocator *__lhs;
  string local_248 [32];
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [36];
  uint local_19c;
  string local_198 [32];
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  string local_110 [12];
  uint in_stack_fffffffffffffefc;
  uint local_ec;
  string local_e8 [4];
  uint in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [38];
  byte local_7a;
  allocator local_79;
  string local_78 [36];
  uint in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  string local_40 [12];
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_20;
  uint local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = 0;
  local_1c = 5;
  local_20 = 6;
  if ((in_EDI == 1) ||
     (((local_10 = in_RSI, in_EDI == 2 ||
       ((in_EDI == 3 && (iVar1 = sscanf(*(char **)(in_RSI + 0x10),"%u",&local_20), iVar1 == 1)))) &&
      (iVar1 = sscanf(*(char **)(local_10 + 8),"%u",&local_1c), iVar1 == 1)))) {
    std::allocator<char>::allocator();
    this_00 = local_40;
    std::__cxx11::string::string
              (this_00,"library version test",(allocator *)&stack0xffffffffffffffbf);
    local_7a = 0;
    uVar2 = init((EVP_PKEY_CTX *)this_00);
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      local_7a = 1;
      std::__cxx11::string::string(local_78,"header and binary version mismatch",&local_79);
    }
    else {
      std::__cxx11::string::string(local_78);
    }
    iVar1 = report((string *)in_stack_fffffffffffffd78,
                   (string *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    local_18 = local_18 + iVar1;
    std::__cxx11::string::~string(local_78);
    if ((local_7a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
    local_14 = local_14 + 1;
    path_test_abi_cxx11_
              (in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    __lhs = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"path graph test",__lhs);
    std::__cxx11::string::string(local_e8,local_a0);
    iVar1 = report((string *)in_stack_fffffffffffffd78,
                   (string *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    local_18 = local_18 + iVar1;
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    local_14 = local_14 + 1;
    for (local_ec = 1; local_ec <= local_1c; local_ec = local_ec + 1) {
      hypercube_test_abi_cxx11_
                (in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      in_stack_fffffffffffffd78 = &local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"hypercube test #",in_stack_fffffffffffffd78);
      stringize<unsigned_int>(in_stack_fffffffffffffefc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar1,in_stack_fffffffffffffd80));
      std::__cxx11::string::string(local_198,local_110);
      in_stack_fffffffffffffd74 =
           report((string *)in_stack_fffffffffffffd78,
                  (string *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                  (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      local_18 = local_18 + in_stack_fffffffffffffd74;
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      local_14 = local_14 + 1;
      std::__cxx11::string::~string(local_110);
    }
    for (local_19c = 1; local_19c <= local_20; local_19c = local_19c + 1) {
      grid_test_abi_cxx11_
                (in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      paVar3 = &local_201;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"grid test #",paVar3);
      columns = (int)((ulong)paVar3 >> 0x20);
      stringize<unsigned_int>(in_stack_fffffffffffffefc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar1,in_stack_fffffffffffffd80));
      std::__cxx11::string::string(local_248,local_1c0);
      in_stack_fffffffffffffd64 =
           report((string *)in_stack_fffffffffffffd78,
                  (string *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),columns);
      local_18 = local_18 + in_stack_fffffffffffffd64;
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      local_14 = local_14 + 1;
      std::__cxx11::string::~string(local_1c0);
    }
    local_4 = finish(CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
    std::__cxx11::string::~string(local_a0);
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"Usage: testgecko [maxdims [maxsize]]");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  uint tests = 0;    // number of tests performed
  uint failures = 0; // number of failed tests
  uint maxdims = 5;  // number of hypercube dimensions
  uint maxsize = 6;  // max grid dimensions

  switch (argc) {
    case 3:
      if (sscanf(argv[2], "%u", &maxsize) != 1)
        goto usage;
      // FALLTHROUGH
    case 2:
      if (sscanf(argv[1], "%u", &maxdims) != 1)
        goto usage;
      // FALLTHROUGH
    case 1:
      break;
    default:
    usage:
      std::cerr << "Usage: testgecko [maxdims [maxsize]]" << std::endl;
      return EXIT_FAILURE;
  }

  // print version info and ensure header matches binary
  failures += report("library version test", init() ? std::string() : std::string("header and binary version mismatch"));
  tests++;

  // order path
  std::string error = path_test();
  failures += report("path graph test", error);
  tests++;

  // order hypercubes
  for (uint dims = 1; dims <= maxdims; dims++) {
    std::string error = hypercube_test(dims);
    failures += report(std::string("hypercube test #") + stringize(dims), error);
    tests++;
  }

  // order grids
  for (uint size = 1; size <= maxsize; size++) {
    std::string error = grid_test(size);
    failures += report(std::string("grid test #") + stringize(size), error);
    tests++;
  }

  // summarize tests
  return finish(failures, tests);
}